

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ifUtil.c
# Opt level: O0

void If_ObjPrint(If_Obj_t *pObj)

{
  uint uVar1;
  int iVar2;
  uint uVar3;
  If_Obj_t *pIVar4;
  char *pcVar5;
  char *pcVar6;
  If_Obj_t *pObj_local;
  
  if (pObj == (If_Obj_t *)0x0) {
    printf("Object is NULL.");
  }
  else {
    uVar1 = If_ObjId(pObj);
    printf("Obj %4d : ",(ulong)uVar1);
    iVar2 = If_ObjIsConst1(pObj);
    if (iVar2 == 0) {
      iVar2 = If_ObjIsCi(pObj);
      if (iVar2 == 0) {
        iVar2 = If_ObjIsCo(pObj);
        if (iVar2 == 0) {
          pIVar4 = If_ObjFanin0(pObj);
          uVar1 = If_ObjId(pIVar4);
          iVar2 = If_ObjFaninC0(pObj);
          pcVar5 = " ";
          if (iVar2 != 0) {
            pcVar5 = "\'";
          }
          pIVar4 = If_ObjFanin1(pObj);
          uVar3 = If_ObjId(pIVar4);
          iVar2 = If_ObjFaninC1(pObj);
          pcVar6 = " ";
          if (iVar2 != 0) {
            pcVar6 = "\'";
          }
          printf("AND( %4d%s, %4d%s )",(ulong)uVar1,pcVar5,(ulong)uVar3,pcVar6);
        }
        else {
          pIVar4 = If_ObjFanin0(pObj);
          uVar1 = If_ObjId(pIVar4);
          iVar2 = If_ObjFaninC0(pObj);
          pcVar5 = " ";
          if (iVar2 != 0) {
            pcVar5 = "\'";
          }
          printf("PO( %4d%s )",(ulong)uVar1,pcVar5);
        }
      }
      else {
        printf("PI");
      }
    }
    else {
      printf("constant 1");
    }
    printf(" (refs = %3d)",(ulong)(uint)pObj->nVisitsCopy);
    printf("\n");
  }
  return;
}

Assistant:

void If_ObjPrint( If_Obj_t * pObj )
{
    if ( pObj == NULL )
    {
        printf( "Object is NULL." );
        return;
    }
    printf( "Obj %4d : ", If_ObjId(pObj) );
    if ( If_ObjIsConst1(pObj) )
        printf( "constant 1" );
    else if ( If_ObjIsCi(pObj) )
        printf( "PI" );
    else if ( If_ObjIsCo(pObj) )
        printf( "PO( %4d%s )", If_ObjId(If_ObjFanin0(pObj)), (If_ObjFaninC0(pObj)? "\'" : " ") );
    else
        printf( "AND( %4d%s, %4d%s )", 
            If_ObjId(If_ObjFanin0(pObj)), (If_ObjFaninC0(pObj)? "\'" : " "), 
            If_ObjId(If_ObjFanin1(pObj)), (If_ObjFaninC1(pObj)? "\'" : " ") );
    printf( " (refs = %3d)", pObj->nVisitsCopy );
    printf( "\n" );
}